

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::buildBinary(TranslateToFuzzReader *this,BinaryArgs *args)

{
  Binary *pBVar1;
  
  pBVar1 = Builder::makeBinary(&this->builder,args->a,args->b,args->c);
  return (Expression *)pBVar1;
}

Assistant:

Expression* TranslateToFuzzReader::buildBinary(const BinaryArgs& args) {
  return builder.makeBinary(args.a, args.b, args.c);
}